

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_rendering_attachment_location_info
          (Impl *this,Value *state,VkRenderingAttachmentLocationInfoKHR **out_info)

{
  bool bVar1;
  uint uVar2;
  VkRenderingAttachmentLocationInfo *pVVar3;
  Type pGVar4;
  uint *puVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  uint local_34;
  uint32_t i;
  uint *locs;
  VkRenderingAttachmentLocationInfo *info;
  VkRenderingAttachmentLocationInfoKHR **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkRenderingAttachmentLocationInfo>(&this->allocator);
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"colorAttachmentCount");
  uVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->colorAttachmentCount = uVar2;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"colorAttachmentLocations");
  if (bVar1) {
    puVar5 = ScratchAllocator::allocate_n_cleared<unsigned_int>
                       (&this->allocator,(ulong)pVVar3->colorAttachmentCount);
    for (local_34 = 0; local_34 < pVVar3->colorAttachmentCount; local_34 = local_34 + 1) {
      pGVar4 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"colorAttachmentLocations");
      this_00 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::operator[](pGVar4,local_34);
      uVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetUint(this_00);
      puVar5[local_34] = uVar2;
    }
    pVVar3->pColorAttachmentLocations = puVar5;
  }
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_rendering_attachment_location_info(const Value &state, VkRenderingAttachmentLocationInfoKHR **out_info)
{
	auto *info = allocator.allocate_cleared<VkRenderingAttachmentLocationInfoKHR>();
	info->colorAttachmentCount = state["colorAttachmentCount"].GetUint();
	if (state.HasMember("colorAttachmentLocations"))
	{
		auto *locs = allocator.allocate_n_cleared<uint32_t>(info->colorAttachmentCount);
		for (uint32_t i = 0; i < info->colorAttachmentCount; i++)
			locs[i] = state["colorAttachmentLocations"][i].GetUint();
		info->pColorAttachmentLocations = locs;
	}

	*out_info = info;
	return true;
}